

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall
cmFindLibraryHelper::cmFindLibraryHelper
          (cmFindLibraryHelper *this,string *debugName,cmMakefile *mf,cmFindBase *base)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  cmGlobalGenerator *pcVar4;
  cmValue cVar5;
  cmValue cVar6;
  cmState *this_00;
  string_view arg;
  string_view arg_00;
  allocator<char> local_89 [9];
  string local_80;
  string *local_60;
  string *local_58;
  string local_50;
  
  this->Makefile = mf;
  this->FindBase = base;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PrefixRegexStr)._M_dataplus._M_p = (pointer)&(this->PrefixRegexStr).field_2;
  (this->PrefixRegexStr)._M_string_length = 0;
  (this->PrefixRegexStr).field_2._M_local_buf[0] = '\0';
  (this->SuffixRegexStr)._M_dataplus._M_p = (pointer)&(this->SuffixRegexStr).field_2;
  (this->SuffixRegexStr)._M_string_length = 0;
  (this->SuffixRegexStr).field_2._M_local_buf[0] = '\0';
  (this->BestPath)._M_dataplus._M_p = (pointer)&(this->BestPath).field_2;
  (this->BestPath)._M_string_length = 0;
  (this->BestPath).field_2._M_local_buf[0] = '\0';
  this->DebugMode = (base->super_cmFindCommon).DebugMode;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TestPath)._M_dataplus._M_p = (pointer)&(this->TestPath).field_2;
  (this->TestPath)._M_string_length = 0;
  local_58 = &this->PrefixRegexStr;
  local_60 = &this->SuffixRegexStr;
  (this->TestPath).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_50,(string *)debugName);
  cmFindBaseDebugState::cmFindBaseDebugState(&this->DebugSearches,&local_50,base);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar4 = cmMakefile::GetGlobalGenerator(this->Makefile);
  this->GG = pcVar4;
  pcVar1 = this->Makefile;
  if ((anonymous_namespace)::get_prefixes[abi:cxx11](cmMakefile*)::defaultPrefix_abi_cxx11_ == '\0')
  {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::get_prefixes[abi:cxx11](cmMakefile*)::
                                 defaultPrefix_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (anonymous_namespace)::get_prefixes[abi:cxx11](cmMakefile*)::
                 defaultPrefix_abi_cxx11_,"lib",(allocator<char> *)&local_80);
      __cxa_atexit(std::__cxx11::string::~string,
                   (anonymous_namespace)::get_prefixes[abi:cxx11](cmMakefile*)::
                   defaultPrefix_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::get_prefixes[abi:cxx11](cmMakefile*)::
                           defaultPrefix_abi_cxx11_);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_FIND_LIBRARY_PREFIXES",local_89);
  cVar5 = cmMakefile::GetDefinition(pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  cVar6.Value = (string *)
                (anonymous_namespace)::get_prefixes[abi:cxx11](cmMakefile*)::
                defaultPrefix_abi_cxx11_;
  if (cVar5.Value != (string *)0x0) {
    cVar6 = cVar5;
  }
  pcVar1 = this->Makefile;
  if ((anonymous_namespace)::get_suffixes[abi:cxx11](cmMakefile*)::defaultSuffix_abi_cxx11_ == '\0')
  {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::get_suffixes[abi:cxx11](cmMakefile*)::
                                 defaultSuffix_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &(anonymous_namespace)::get_suffixes[abi:cxx11](cmMakefile*)::
                  defaultSuffix_abi_cxx11_,".so;.a",(allocator<char> *)&local_80);
      __cxa_atexit(std::__cxx11::string::~string,
                   &(anonymous_namespace)::get_suffixes[abi:cxx11](cmMakefile*)::
                    defaultSuffix_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::get_suffixes[abi:cxx11](cmMakefile*)::
                           defaultSuffix_abi_cxx11_);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_FIND_LIBRARY_SUFFIXES",local_89);
  cVar5 = cmMakefile::GetDefinition(pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  arg._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
  arg._M_len = (cVar6.Value)->_M_string_length;
  cmExpandList(arg,&this->Prefixes,true);
  cVar6.Value = (string *)
                &(anonymous_namespace)::get_suffixes[abi:cxx11](cmMakefile*)::
                 defaultSuffix_abi_cxx11_;
  if (cVar5.Value != (string *)0x0) {
    cVar6 = cVar5;
  }
  arg_00._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
  arg_00._M_len = (cVar6.Value)->_M_string_length;
  cmExpandList(arg_00,&this->Suffixes,true);
  RegexFromList(this,local_58,&this->Prefixes);
  RegexFromList(this,local_60,&this->Suffixes);
  this_00 = cmMakefile::GetState(this->Makefile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"FIND_LIBRARY_USE_OPENBSD_VERSIONING",local_89);
  bVar2 = cmState::GetGlobalPropertyAsBool(this_00,&local_80);
  this->OpenBSD = bVar2;
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

cmFindLibraryHelper::cmFindLibraryHelper(std::string debugName, cmMakefile* mf,
                                         cmFindBase const* base)
  : Makefile(mf)
  , FindBase(base)
  , DebugMode(base->DebugModeEnabled())
  , DebugSearches(std::move(debugName), base)
{
  this->GG = this->Makefile->GetGlobalGenerator();

  // Collect the list of library name prefixes/suffixes to try.
  std::string const& prefixes_list = get_prefixes(this->Makefile);
  std::string const& suffixes_list = get_suffixes(this->Makefile);

  cmExpandList(prefixes_list, this->Prefixes, true);
  cmExpandList(suffixes_list, this->Suffixes, true);
  this->RegexFromList(this->PrefixRegexStr, this->Prefixes);
  this->RegexFromList(this->SuffixRegexStr, this->Suffixes);

  // Check whether to use OpenBSD-style library version comparisons.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");
}